

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentLocation __thiscall
ON_SubDMeshFragmentIterator::SubDAppearance(ON_SubDMeshFragmentIterator *this)

{
  ON_SubD *this_00;
  ON_SubDComponentLocation local_19;
  ON_SubDMeshFragmentIterator *this_local;
  
  if ((this->m_subd_appearance_override == Surface) ||
     (this->m_subd_appearance_override == ControlNet)) {
    local_19 = this->m_subd_appearance_override;
  }
  else {
    this_00 = SubD(this);
    local_19 = ON_SubD::SubDAppearance(this_00);
  }
  return local_19;
}

Assistant:

ON_SubDComponentLocation ON_SubDMeshFragmentIterator::SubDAppearance() const
{
  return 
    (ON_SubDComponentLocation::Surface == m_subd_appearance_override || ON_SubDComponentLocation::ControlNet == m_subd_appearance_override)
    ? m_subd_appearance_override
    : SubD().SubDAppearance();
}